

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O0

void ncnn::deformableconv2d_transform_kernel_packed_sse
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,int kernel_w,
               int kernel_h,int elempack,int out_elempack)

{
  undefined4 uVar1;
  int *piVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  int in_ECX;
  int in_EDX;
  void **in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int ic;
  int j;
  int i;
  int oc;
  float *ptr;
  float *weight_ptr;
  int maxk;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int in_stack_fffffffffffffe7c;
  size_t in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe8c;
  Mat *in_stack_fffffffffffffe90;
  void **ppvVar6;
  void *local_128;
  int *local_120;
  void *local_118;
  undefined4 local_110;
  long *local_108;
  undefined4 local_100;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  void *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  void *local_d0;
  long local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  Mat *in_stack_ffffffffffffff68;
  
  local_bc = in_R8D * in_R9D;
  local_c8 = *in_RDI;
  local_b8 = in_R9D;
  local_b4 = in_R8D;
  Mat::create(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
              in_stack_fffffffffffffe7c,
              (Allocator *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  local_d0 = *in_RSI;
  for (local_d4 = 0; local_d4 < in_ECX; local_d4 = local_d4 + 1) {
    for (local_d8 = 0; local_d8 < local_b8; local_d8 = local_d8 + 1) {
      for (local_dc = 0; local_dc < local_b4; local_dc = local_dc + 1) {
        for (local_e0 = 0; lVar4 = local_c8, local_e0 < in_EDX; local_e0 = local_e0 + 1) {
          iVar5 = _4Dindex_to_1Dindex(local_d4,local_e0,local_d8,local_dc,in_EDX,local_b8,local_b4);
          pvVar3 = local_d0;
          uVar1 = *(undefined4 *)(lVar4 + (long)iVar5 * 4);
          iVar5 = _6Dindex_to_1Dindex(local_d4 / in_stack_00000010,local_d8,local_dc,
                                      local_e0 / in_stack_00000008,local_e0 % in_stack_00000008,
                                      local_d4 % in_stack_00000010,local_b8,local_b4,
                                      in_EDX / in_stack_00000008,in_stack_00000008,in_stack_00000010
                                     );
          *(undefined4 *)((long)pvVar3 + (long)iVar5 * 4) = uVar1;
        }
      }
    }
  }
  Mat::reshape(in_stack_ffffffffffffff68,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
               (int)((ulong)in_RSI >> 0x20),(Allocator *)CONCAT44(in_EDX,in_ECX));
  if (in_RSI != &local_128) {
    if (local_120 != (int *)0x0) {
      LOCK();
      *local_120 = *local_120 + 1;
      UNLOCK();
    }
    if (in_RSI[1] != (void *)0x0) {
      piVar2 = (int *)in_RSI[1];
      LOCK();
      iVar5 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (iVar5 == 1) {
        if (in_RSI[4] == (void *)0x0) {
          if (*in_RSI != (void *)0x0) {
            free(*in_RSI);
          }
        }
        else {
          (**(code **)(*in_RSI[4] + 0x18))(in_RSI[4],*in_RSI);
        }
      }
    }
    *in_RSI = (void *)0x0;
    in_RSI[2] = (void *)0x0;
    *(undefined4 *)(in_RSI + 3) = 0;
    *(undefined4 *)(in_RSI + 5) = 0;
    *(undefined4 *)((long)in_RSI + 0x2c) = 0;
    *(undefined4 *)(in_RSI + 6) = 0;
    *(undefined4 *)((long)in_RSI + 0x34) = 0;
    *(undefined4 *)(in_RSI + 7) = 0;
    in_RSI[8] = (void *)0x0;
    in_RSI[1] = (void *)0x0;
    *in_RSI = local_128;
    in_RSI[1] = local_120;
    in_RSI[2] = local_118;
    *(undefined4 *)(in_RSI + 3) = local_110;
    in_RSI[4] = local_108;
    *(undefined4 *)(in_RSI + 5) = local_100;
    *(undefined4 *)((long)in_RSI + 0x2c) = local_fc;
    *(undefined4 *)(in_RSI + 6) = local_f8;
    *(undefined4 *)((long)in_RSI + 0x34) = local_f4;
    *(undefined4 *)(in_RSI + 7) = local_f0;
    in_RSI[8] = local_e8;
  }
  ppvVar6 = &local_128;
  if (local_120 != (int *)0x0) {
    LOCK();
    iVar5 = *local_120;
    *local_120 = *local_120 + -1;
    UNLOCK();
    if (iVar5 == 1) {
      if (local_108 == (long *)0x0) {
        if (local_128 != (void *)0x0) {
          free(local_128);
        }
      }
      else {
        (**(code **)(*local_108 + 0x18))(local_108,local_128);
      }
    }
  }
  *ppvVar6 = (void *)0x0;
  ppvVar6[2] = (void *)0x0;
  *(undefined4 *)(ppvVar6 + 3) = 0;
  *(undefined4 *)(ppvVar6 + 5) = 0;
  *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
  *(undefined4 *)(ppvVar6 + 6) = 0;
  *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
  *(undefined4 *)(ppvVar6 + 7) = 0;
  ppvVar6[8] = (void *)0x0;
  ppvVar6[1] = (void *)0x0;
  return;
}

Assistant:

static void deformableconv2d_transform_kernel_packed_sse(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, int kernel_w, int kernel_h, int elempack, int out_elempack)
{
    const int maxk = kernel_w * kernel_h;

    // src = kw-kh-inch-outch
    // dst = pb-pa-inch/pa-kw-kh-outch/pb
    {
        const float* weight_ptr = weight_data;

        weight_data_tm.create(num_input * maxk * num_output / (elempack * out_elempack), (size_t)4u * elempack * out_elempack, elempack * out_elempack);
        float* ptr = weight_data_tm;
        for (int oc = 0; oc < num_output; oc++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    for (int ic = 0; ic < num_input; ic++)
                    {
                        ptr[_6Dindex_to_1Dindex(oc / out_elempack, i, j, ic / elempack, ic % elempack, oc % out_elempack, kernel_h, kernel_w, num_input / elempack, elempack, out_elempack)] = weight_ptr[_4Dindex_to_1Dindex(oc, ic, i, j, num_input, kernel_h, kernel_w)];
                    }
                }
            }
        }
        weight_data_tm = weight_data_tm.reshape(num_input / elempack, maxk, num_output / out_elempack);
    }
}